

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O1

int Div_FindDiv(Vec_Int_t *vA,Vec_Int_t *vB,int *pLitsA,int *pLitsB)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  
  piVar9 = vA->pArray;
  iVar7 = vA->nSize;
  piVar2 = piVar9 + iVar7;
  piVar8 = vB->pArray;
  iVar4 = vB->nSize;
  piVar3 = piVar8 + iVar4;
  piVar1 = pLitsB + 1;
  pLitsB[0] = -1;
  pLitsB[1] = -1;
  piVar10 = pLitsA + 1;
  pLitsA[0] = -1;
  pLitsA[1] = -1;
  iVar6 = 0;
  if (0 < iVar4 && 0 < (long)iVar7) {
    iVar6 = 0;
    do {
      iVar7 = *piVar9;
      iVar4 = *piVar8;
      if (iVar7 == iVar4) {
        piVar9 = piVar9 + 1;
        piVar8 = piVar8 + 1;
        iVar6 = iVar6 + 1;
      }
      else if (iVar7 < iVar4) {
        piVar9 = piVar9 + 1;
        if (*pLitsA == -1) {
          *pLitsA = iVar7;
        }
        else {
          if (*piVar10 != -1) {
            return -1;
          }
          *piVar10 = iVar7;
        }
      }
      else {
        piVar8 = piVar8 + 1;
        if (*pLitsB == -1) {
          *pLitsB = iVar4;
        }
        else {
          if (*piVar1 != -1) {
            return -1;
          }
          *piVar1 = iVar4;
        }
      }
    } while ((piVar9 < piVar2) && (piVar8 < piVar3));
  }
  if (piVar9 < piVar2) {
    iVar7 = *pLitsA;
    do {
      iVar4 = *piVar9;
      piVar11 = pLitsA;
      iVar5 = iVar4;
      if ((iVar7 != -1) && (piVar11 = piVar10, iVar5 = iVar7, *piVar10 != -1)) {
        return -1;
      }
      iVar7 = iVar5;
      piVar9 = piVar9 + 1;
      *piVar11 = iVar4;
    } while (piVar9 < piVar2);
  }
  if (piVar8 < piVar3) {
    iVar7 = *pLitsB;
    do {
      iVar4 = *piVar8;
      piVar10 = pLitsB;
      iVar5 = iVar4;
      if ((iVar7 != -1) && (piVar10 = piVar1, iVar5 = iVar7, *piVar1 != -1)) {
        return -1;
      }
      iVar7 = iVar5;
      piVar8 = piVar8 + 1;
      *piVar10 = iVar4;
    } while (piVar8 < piVar3);
  }
  return iVar6;
}

Assistant:

int Div_FindDiv( Vec_Int_t * vA, Vec_Int_t * vB, int pLitsA[2], int pLitsB[2] )
{
    int Counter = 0;
    int * pBegA = vA->pArray, * pEndA = vA->pArray + vA->nSize;
    int * pBegB = vB->pArray, * pEndB = vB->pArray + vB->nSize; 
    pLitsA[0] = pLitsA[1] = pLitsB[0] = pLitsB[1] = -1;
    while ( pBegA < pEndA && pBegB < pEndB )
    {
        if ( *pBegA == *pBegB )
            pBegA++, pBegB++, Counter++;
        else if ( *pBegA < *pBegB )
        {
            if ( Div_AddLit( *pBegA++, pLitsA ) )
                return -1;
        }
        else  
        {
            if ( Div_AddLit( *pBegB++, pLitsB ) )
                return -1;
        }
    }
    while ( pBegA < pEndA )
        if ( Div_AddLit( *pBegA++, pLitsA ) )
            return -1;
    while ( pBegB < pEndB )
        if ( Div_AddLit( *pBegB++, pLitsB ) )
            return -1;
    return Counter;
}